

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O3

json __thiscall hta::read_json_from_file(hta *this,path *path)

{
  long lVar1;
  json_value extraout_RDX;
  json jVar2;
  ifstream config_file;
  undefined1 auStack_228 [8];
  long local_220 [3];
  undefined4 auStack_204 [123];
  
  std::ifstream::ifstream(local_220);
  lVar1 = *(long *)(local_220[0] + -0x18);
  *(undefined4 *)((long)auStack_204 + lVar1) = 5;
  std::ios::clear((int)auStack_228 + (int)lVar1 + 8);
  std::ifstream::open((char *)local_220,(_Ios_Openmode)(path->_M_pathname)._M_dataplus._M_p);
  *this = (hta)0x0;
  *(undefined8 *)(this + 8) = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)this);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)this);
  nlohmann::operator>>
            ((istream *)local_220,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)this);
  std::ifstream::~ifstream(local_220);
  jVar2.m_value.object = extraout_RDX.object;
  jVar2._0_8_ = this;
  return jVar2;
}

Assistant:

json read_json_from_file(const std::filesystem::path& path)
{
    std::ifstream config_file;
    config_file.exceptions(std::ios::badbit | std::ios::failbit);
    config_file.open(path);
    json config;
    config_file >> config;
    return config;
}